

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O1

MPP_RET hal_jpegd_vdpu2_deinit(void *hal)

{
  MPP_RET MVar1;
  char *fmt;
  int level;
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_deinit");
  }
  if (*(MppDev *)((long)hal + 0x10) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if ((*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) ||
     (MVar1 = mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x28),"hal_jpegd_vdpu2_deinit"),
     MVar1 == MPP_OK)) {
    if ((*(MppBufferGroup *)((long)hal + 0x20) == (MppBufferGroup)0x0) ||
       (MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x20)), MVar1 == MPP_OK)) {
      if (*(void **)((long)hal + 0x18) != (void *)0x0) {
        mpp_osal_free("hal_jpegd_vdpu2_deinit",*(void **)((long)hal + 0x18));
        *(undefined8 *)((long)hal + 0x18) = 0;
      }
      *(undefined8 *)((long)hal + 0x94) = 0;
      *(undefined8 *)((long)hal + 0x9c) = 0;
      if (((byte)jpegd_debug & 1) == 0) {
        return MPP_OK;
      }
      fmt = "exit\n";
      MVar1 = MPP_OK;
      level = 4;
      goto LAB_0020f928;
    }
    fmt = "group free buffer failed\n";
  }
  else {
    fmt = "put table buffer failed\n";
  }
  level = 2;
LAB_0020f928:
  _mpp_log_l(level,"HAL_JPEG_VDPU2",fmt,"hal_jpegd_vdpu2_deinit");
  return MVar1;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;

    jpegd_dbg_func("enter\n");

    if (JpegHalCtx->dev) {
        mpp_dev_deinit(JpegHalCtx->dev);
        JpegHalCtx->dev = NULL;
    }

    if (JpegHalCtx->pTableBase) {
        ret = mpp_buffer_put(JpegHalCtx->pTableBase);
        if (ret) {
            mpp_err_f("put table buffer failed\n");
            return ret;
        }
    }

    if (JpegHalCtx->group) {
        ret = mpp_buffer_group_put(JpegHalCtx->group);
        if (ret) {
            mpp_err_f("group free buffer failed\n");
            return ret;
        }
    }

    if (JpegHalCtx->regs) {
        mpp_free(JpegHalCtx->regs);
        JpegHalCtx->regs = NULL;
    }

    JpegHalCtx->set_output_fmt_flag = 0;
    JpegHalCtx->hal_debug_enable = 0;
    JpegHalCtx->frame_count = 0;
    JpegHalCtx->output_yuv_count = 0;

    jpegd_dbg_func("exit\n");
    return MPP_OK;
}